

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O2

void uv__fs_work(uv__work *w)

{
  int iVar1;
  _func_void_uv__work_ptr_int *p_Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint *puVar8;
  ssize_t sVar9;
  _func_void_uv__work_ptr *p_Var10;
  char *pcVar11;
  size_t sVar12;
  ssize_t sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  code *process;
  double dVar17;
  _func_void_uv__work_ptr_int *p_Stack_20c0;
  _func_void_uv__work_ptr_int *local_20a0;
  pollfd pfd;
  _func_void_uv__work_ptr_int *local_2058 [4];
  stat pbuf;
  
  iVar1 = *(int *)&w[-7].done;
  puVar8 = (uint *)__errno_location();
LAB_004fdf01:
  *puVar8 = 0;
  switch(*(undefined4 *)&w[-7].done) {
  case 1:
    if (uv__fs_open_no_cloexec_support != '\0') {
LAB_004fdf5c:
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdlock(&(w[-7].loop)->cloexec_lock);
      }
      iVar4 = open64((char *)w[-6].done,*(int *)((long)w[-2].wq + 4),(ulong)*(uint *)(w[-2].wq + 1))
      ;
      if ((-1 < iVar4) && (iVar5 = uv__cloexec_ioctl(iVar4,1), iVar5 != 0)) {
        iVar4 = uv__close(iVar4);
        if (iVar4 != 0) {
switchD_004fdf1e_default:
          abort();
        }
        iVar4 = -1;
      }
      if (w[-7].wq[0] != (void *)0x0) {
        uv_rwlock_rdunlock(&(w[-7].loop)->cloexec_lock);
      }
      goto LAB_004fe65e;
    }
    uVar6 = open64((char *)w[-6].done,*(uint *)((long)w[-2].wq + 4) | 0x80000,
                   (ulong)*(uint *)(w[-2].wq + 1));
    if ((int)uVar6 < 0) {
      if (*puVar8 != 0x16) break;
      uv__fs_open_no_cloexec_support = '\x01';
      goto LAB_004fdf5c;
    }
    p_Stack_20c0 = (_func_void_uv__work_ptr_int *)(ulong)uVar6;
    goto LAB_004fe6ff;
  case 2:
    uVar6 = close(*(int *)w[-2].wq);
    break;
  case 3:
    process = uv__fs_read;
    goto LAB_004fe15f;
  case 4:
    process = uv__fs_write;
LAB_004fe15f:
    p_Stack_20c0 = (_func_void_uv__work_ptr_int *)uv__fs_buf_iter((uv_fs_t *)w[-9].wq,process);
    goto LAB_004fe661;
  case 5:
    local_2058[0] = w[-1].done;
    sVar13 = sendfile64(*(int *)w[-2].wq,*(int *)((long)w[-2].wq + 4),(__off64_t *)local_2058,
                        (size_t)w[1].done);
    local_20a0 = w[-1].done;
    p_Stack_20c0 = local_2058[0] + -(long)local_20a0;
    if ((p_Stack_20c0 == (_func_void_uv__work_ptr_int *)0x0 ||
        (long)local_2058[0] < (long)local_20a0) && sVar13 == -1) {
      uVar6 = *puVar8;
      if (((uVar6 < 0x17) && ((0x440020U >> (uVar6 & 0x1f) & 1) != 0)) || (uVar6 == 0x58)) {
        *puVar8 = 0;
        p_Var2 = w[1].done;
        iVar4 = *(int *)w[-2].wq;
        iVar5 = *(int *)((long)w[-2].wq + 4);
        bVar3 = true;
        p_Stack_20c0 = (_func_void_uv__work_ptr_int *)0x0;
LAB_004fe4f6:
        for (; uVar16 = (long)p_Var2 - (long)p_Stack_20c0, p_Stack_20c0 <= p_Var2 && uVar16 != 0;
            p_Stack_20c0 = p_Stack_20c0 + lVar14) {
          sVar12 = 0x2000;
          if (uVar16 < 0x2000) {
            sVar12 = uVar16;
          }
          while( true ) {
            if (bVar3) {
              lVar14 = pread64(iVar5,&pbuf,sVar12,(__off64_t)local_20a0);
            }
            else {
              lVar14 = read(iVar5,&pbuf,sVar12);
            }
            if (lVar14 != -1) break;
            uVar6 = *puVar8;
            if (uVar6 != 4) goto code_r0x004fe54c;
          }
          if (lVar14 == 0) break;
          for (lVar15 = 0; lVar14 - lVar15 != 0 && lVar15 <= lVar14; lVar15 = lVar15 + sVar13) {
            while (sVar13 = write(iVar4,(void *)((long)pbuf.__glibc_reserved + lVar15 + -0x78),
                                  lVar14 - lVar15), sVar13 == -1) {
              if (*puVar8 != 4) {
                if (*puVar8 != 0xb) goto LAB_004fe6a6;
                pfd.events = 4;
                pfd.revents = 0;
                pfd.fd = iVar4;
                while (iVar7 = poll((pollfd *)&pfd,1,-1), iVar7 == -1) {
                  if (*puVar8 != 4) goto LAB_004fe69e;
                }
                if (((ulong)pfd & 0xfffb000000000000) != 0) {
LAB_004fe69e:
                  *puVar8 = 5;
                  goto LAB_004fe6a6;
                }
              }
            }
          }
          local_20a0 = local_20a0 + lVar14;
        }
        if (p_Stack_20c0 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) goto LAB_004fe693;
        goto LAB_004fe6d4;
      }
      p_Stack_20c0 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    }
    else {
      w[-1].done = local_2058[0];
    }
    goto LAB_004fe661;
  case 6:
    iVar4 = stat64((char *)w[-6].done,(stat64 *)&pbuf);
    goto LAB_004fe244;
  case 7:
    iVar4 = lstat64((char *)w[-6].done,(stat64 *)&pbuf);
    goto LAB_004fe244;
  case 8:
    iVar4 = fstat64(*(int *)w[-2].wq,(stat64 *)&pbuf);
LAB_004fe244:
    if (iVar4 == 0) {
      uv__to_stat(&pbuf,(uv_stat_t *)&w[-6].loop);
    }
LAB_004fe65e:
    p_Stack_20c0 = (_func_void_uv__work_ptr_int *)(long)iVar4;
    goto LAB_004fe661;
  case 9:
    uVar6 = ftruncate64(*(int *)w[-2].wq,(__off64_t)w[-1].done);
    break;
  case 10:
    pbuf.st_dev = (__dev_t)(double)w[-1].wq[0];
    pbuf.st_ino = (__ino_t)(double)w[-1].wq[1];
    uVar6 = utime((char *)w[-6].done,(utimbuf *)&pbuf);
    break;
  case 0xb:
    if (uv__fs_futime_no_utimesat == '\0') {
      pbuf.st_dev = (__dev_t)(double)w[-1].wq[0];
      dVar17 = (double)w[-1].wq[0] * 1000000.0;
      uVar16 = (ulong)dVar17;
      p_Stack_20c0 = (_func_void_uv__work_ptr_int *)0x0;
      pbuf.st_ino = (((long)(dVar17 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) %
                    1000000) * 1000;
      pbuf.st_nlink = (__nlink_t)(double)w[-1].wq[1];
      dVar17 = (double)w[-1].wq[1] * 1000000.0;
      uVar16 = (ulong)dVar17;
      pbuf._24_8_ = (((long)(dVar17 - 9.223372036854776e+18) & (long)uVar16 >> 0x3f | uVar16) %
                    1000000) * 1000;
      uVar6 = uv__utimesat(*(int *)w[-2].wq,(char *)0x0,(timespec *)&pbuf,0);
      if (uVar6 == 0) goto LAB_004fe661;
      if (*puVar8 != 0x26) break;
      uv__fs_futime_no_utimesat = '\x01';
    }
    pfd = (pollfd)(long)(double)w[-1].wq[0];
    p_Stack_20c0 = (_func_void_uv__work_ptr_int *)0x0;
    snprintf((char *)local_2058,0x1b,"/proc/self/fd/%d",(ulong)*(uint *)w[-2].wq);
    iVar4 = utimes((char *)local_2058,(timeval *)&pfd);
    if (iVar4 != 0) {
      uVar6 = *puVar8;
      if (((uVar6 == 0x14) || (uVar6 == 0xd)) ||
         ((uVar6 == 2 &&
          ((iVar5 = fcntl64(*(undefined4 *)w[-2].wq,3), iVar5 != -1 || (*puVar8 != 9)))))) {
        *puVar8 = 0x26;
      }
      goto LAB_004fe65e;
    }
    goto LAB_004fe661;
  case 0xc:
    uVar6 = access((char *)w[-6].done,*(int *)((long)w[-2].wq + 4));
    break;
  case 0xd:
    uVar6 = chmod((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xe:
    uVar6 = fchmod(*(int *)w[-2].wq,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0xf:
    uVar6 = fsync(*(int *)w[-2].wq);
    break;
  case 0x10:
    uVar6 = fdatasync(*(int *)w[-2].wq);
    break;
  case 0x11:
    uVar6 = unlink((char *)w[-6].done);
    break;
  case 0x12:
    uVar6 = rmdir((char *)w[-6].done);
    break;
  case 0x13:
    uVar6 = mkdir((char *)w[-6].done,*(__mode_t *)(w[-2].wq + 1));
    break;
  case 0x14:
    pcVar11 = mkdtemp((char *)w[-6].done);
    p_Stack_20c0 = (_func_void_uv__work_ptr_int *)-(ulong)(pcVar11 == (char *)0x0);
    goto LAB_004fe661;
  case 0x15:
    uVar6 = rename((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x16:
    pbuf.st_dev = 0;
    iVar4 = scandir64((char *)w[-6].done,(dirent64 ***)&pbuf,uv__fs_scandir_filter,
                      uv__fs_scandir_sort);
    *(undefined4 *)((long)w[-2].wq + 0xc) = 0;
    if (iVar4 != -1) {
      p_Var10 = (_func_void_uv__work_ptr *)pbuf.st_dev;
      if (iVar4 == 0) {
        free((void *)pbuf.st_dev);
        p_Var10 = (_func_void_uv__work_ptr *)0x0;
      }
      w[-6].work = p_Var10;
      goto LAB_004fe65e;
    }
LAB_004fe6d4:
    p_Stack_20c0 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
    goto LAB_004fe661;
  case 0x17:
    uVar6 = link((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x18:
    uVar6 = symlink((char *)w[-6].done,(char *)w[-2].loop);
    break;
  case 0x19:
    sVar12 = uv__fs_pathmax_size((char *)w[-6].done);
    p_Var10 = (_func_void_uv__work_ptr *)uv__malloc(sVar12 + 1);
    if (p_Var10 == (_func_void_uv__work_ptr *)0x0) {
      *puVar8 = 0xc;
    }
    else {
      sVar13 = readlink((char *)w[-6].done,(char *)p_Var10,sVar12);
      if (sVar13 != -1) {
        p_Var10[sVar13] = (_func_void_uv__work_ptr)0x0;
LAB_004fe6eb:
        w[-6].work = p_Var10;
        w[-7].wq[1] = (void *)0x0;
        goto LAB_004fe70b;
      }
      uv__free(p_Var10);
    }
    goto LAB_004fe66b;
  case 0x1a:
    uVar6 = chown((char *)w[-6].done,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1b:
    uVar6 = fchown(*(int *)w[-2].wq,*(__uid_t *)&w[-1].loop,*(__gid_t *)((long)&w[-1].loop + 4));
    break;
  case 0x1c:
    sVar9 = uv__fs_pathmax_size((char *)w[-6].done);
    p_Var10 = (_func_void_uv__work_ptr *)uv__malloc(sVar9 + 1);
    if (p_Var10 == (_func_void_uv__work_ptr *)0x0) {
      *puVar8 = 0xc;
    }
    else {
      pcVar11 = realpath((char *)w[-6].done,(char *)p_Var10);
      if (pcVar11 != (char *)0x0) goto LAB_004fe6eb;
      uv__free(p_Var10);
    }
    goto LAB_004fe66b;
  default:
    goto switchD_004fdf1e_default;
  }
  p_Stack_20c0 = (_func_void_uv__work_ptr_int *)(long)(int)uVar6;
  goto LAB_004fe661;
code_r0x004fe54c:
  if ((p_Stack_20c0 != (_func_void_uv__work_ptr_int *)0x0) || (!bVar3)) {
    if (p_Stack_20c0 + 1 < (code *)0x2) goto LAB_004fe6d4;
LAB_004fe693:
    w[-1].done = local_20a0;
    goto LAB_004fe661;
  }
  p_Stack_20c0 = (_func_void_uv__work_ptr_int *)0x0;
  bVar3 = false;
  if ((uVar6 == 5) || (uVar6 == 0x1d)) goto LAB_004fe4f6;
LAB_004fe6a6:
  p_Stack_20c0 = (_func_void_uv__work_ptr_int *)0xffffffffffffffff;
LAB_004fe661:
  if (p_Stack_20c0 != (_func_void_uv__work_ptr_int *)0xffffffffffffffff) {
LAB_004fe6ff:
    w[-7].wq[1] = p_Stack_20c0;
    if (p_Stack_20c0 != (_func_void_uv__work_ptr_int *)0x0) {
      return;
    }
LAB_004fe70b:
    if (2 < *(int *)&w[-7].done - 6U) {
      return;
    }
    w[-6].work = (_func_void_uv__work_ptr *)&w[-6].loop;
    return;
  }
LAB_004fe66b:
  if (((long)(int)*puVar8 != 4) || (iVar1 == 2)) {
    w[-7].wq[1] = (void *)-(long)(int)*puVar8;
    return;
  }
  goto LAB_004fdf01;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, close(req->file));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_buf_iter(req, uv__fs_read));
    X(SCANDIR, uv__fs_scandir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_buf_iter(req, uv__fs_write));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = -errno;
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}